

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utypes.h
# Opt level: O3

BreakIterator * __thiscall
icu_63::RuleBasedBreakIterator::createBufferClone
          (RuleBasedBreakIterator *this,void *param_1,int32_t *bufferSize,UErrorCode *status)

{
  int iVar1;
  undefined4 extraout_var;
  UErrorCode UVar2;
  
  if (*status < U_ILLEGAL_ARGUMENT_ERROR) {
    if (*bufferSize != 0) {
      iVar1 = (*(this->super_BreakIterator).super_UObject._vptr_UObject[4])();
      UVar2 = U_SAFECLONE_ALLOCATED_WARNING;
      if ((BreakIterator *)CONCAT44(extraout_var,iVar1) == (BreakIterator *)0x0) {
        UVar2 = U_MEMORY_ALLOCATION_ERROR;
      }
      *status = UVar2;
      return (BreakIterator *)CONCAT44(extraout_var,iVar1);
    }
    *bufferSize = 1;
  }
  return (BreakIterator *)0x0;
}

Assistant:

static
    inline UBool U_FAILURE(UErrorCode code) { return (UBool)(code>U_ZERO_ERROR); }